

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeLoad
          (ScalarReplacementPass *this,Instruction *load,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  IRContext *pIVar1;
  ScalarReplacementPass *pSVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Instruction *pIVar5;
  Instruction *this_00;
  Operand *pOVar6;
  DefUseManager *pDVar7;
  bool bVar8;
  uint32_t i;
  pointer ppIVar9;
  pointer ppIVar10;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  iterator where;
  Instruction *var;
  pointer local_100;
  Instruction *local_f8;
  uint32_t local_f0;
  uint32_t local_ec;
  BasicBlock *local_e8;
  ScalarReplacementPass *local_e0;
  Operand copy;
  IRContext *local_a8;
  pointer local_a0;
  Instruction *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> loads;
  SmallVector<unsigned_int,_2UL> local_58;
  
  local_e8 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,load);
  loads.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  loads.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  loads.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::reserve
            (&loads,(long)(replacements->
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(replacements->
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3);
  local_100 = (replacements->
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  where.super_iterator.node_ = (iterator)(iterator)load;
  local_e0 = this;
  for (ppIVar9 = (replacements->
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppIVar9 != local_100;
      ppIVar9 = ppIVar9 + 1) {
    var = *ppIVar9;
    if (var->opcode_ == OpVariable) {
      local_a0 = ppIVar9;
      pIVar5 = GetStorageType(this,var);
      uVar3 = Pass::TakeNextId((Pass *)this);
      if (uVar3 == 0) goto LAB_0048c2e2;
      this_00 = (Instruction *)::operator_new(0x70);
      local_a8 = (this->super_MemPass).super_Pass.context_;
      local_f0 = Instruction::result_id(pIVar5);
      local_ec = Instruction::result_id(var);
      init_list._M_len = 1;
      init_list._M_array = &local_ec;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      copy.type = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&copy.words,&local_58);
      local_98 = (Instruction *)0x0;
      uStack_90 = 0;
      local_88 = 0;
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_initialize<spvtools::opt::Operand_const*>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_98,
                 &copy,&local_a8);
      Instruction::Instruction(this_00,local_a8,OpLoad,local_f0,uVar3,(OperandList *)&local_98);
      local_f8 = this_00;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &local_98);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&copy.words);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      ppIVar9 = local_a0;
      uVar3 = 1;
      while( true ) {
        uVar4 = Instruction::NumInOperands(load);
        if (uVar4 <= uVar3) break;
        pOVar6 = Instruction::GetInOperand(load,uVar3);
        Operand::Operand(&copy,pOVar6);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
        emplace_back<spvtools::opt::Operand>(&local_f8->operands_,&copy);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&copy.words);
        uVar3 = uVar3 + 1;
      }
      InstructionList::iterator::InsertBefore
                ((iterator *)&copy,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&where);
      this = local_e0;
      where.super_iterator.node_ = (iterator)(iterator)copy._0_8_;
      pDVar7 = Pass::get_def_use_mgr((Pass *)local_e0);
      analysis::DefUseManager::AnalyzeInstDefUse(pDVar7,(Instruction *)where.super_iterator.node_);
      IRContext::set_instr_block
                ((this->super_MemPass).super_Pass.context_,(Instruction *)where.super_iterator.node_
                 ,local_e8);
      Instruction::UpdateDebugInfoFrom((Instruction *)where.super_iterator.node_,load);
      copy._0_8_ = where.super_iterator.node_;
      std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
      emplace_back<spvtools::opt::Instruction*>
                ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                 &loads,(Instruction **)&copy);
      if (local_f8 != (Instruction *)0x0) {
        (*(local_f8->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1]
        )();
      }
    }
    else {
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(&loads,&var);
    }
  }
  uVar3 = Pass::TakeNextId((Pass *)this);
  if (uVar3 == 0) {
LAB_0048c2e2:
    bVar8 = false;
  }
  else {
    where.super_iterator.node_ = (iterator)(iterator)load;
    pIVar5 = (Instruction *)::operator_new(0x70);
    pIVar1 = (this->super_MemPass).super_Pass.context_;
    uVar4 = Instruction::type_id(load);
    copy.type = SPV_OPERAND_TYPE_NONE;
    copy._4_4_ = 0;
    copy.words._vptr_SmallVector = (_func_int **)0x0;
    copy.words.size_ = 0;
    local_100 = (pointer)CONCAT44(local_100._4_4_,uVar3);
    Instruction::Instruction(pIVar5,pIVar1,OpCompositeConstruct,uVar4,uVar3,(OperandList *)&copy);
    local_98 = pIVar5;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&copy);
    ppIVar9 = loads.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar10 = loads.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppIVar10 != ppIVar9;
        ppIVar10 = ppIVar10 + 1) {
      uVar3 = Instruction::result_id(*ppIVar10);
      var = (Instruction *)CONCAT44(var._4_4_,uVar3);
      init_list_00._M_len = 1;
      init_list_00._M_array = (iterator)&var;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
      copy.type = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&copy.words,&local_58);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&pIVar5->operands_,&copy);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&copy.words);
    }
    InstructionList::iterator::InsertBefore
              ((iterator *)&copy,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&where);
    pSVar2 = local_e0;
    where.super_iterator.node_ = (iterator)(iterator)copy._0_8_;
    pDVar7 = Pass::get_def_use_mgr((Pass *)local_e0);
    analysis::DefUseManager::AnalyzeInstDefUse(pDVar7,(Instruction *)where.super_iterator.node_);
    Instruction::UpdateDebugInfoFrom((Instruction *)where.super_iterator.node_,load);
    IRContext::set_instr_block
              ((pSVar2->super_MemPass).super_Pass.context_,(Instruction *)where.super_iterator.node_
               ,local_e8);
    pIVar1 = (pSVar2->super_MemPass).super_Pass.context_;
    uVar3 = Instruction::result_id(load);
    IRContext::ReplaceAllUsesWith(pIVar1,uVar3,(uint32_t)local_100);
    if (local_98 != (Instruction *)0x0) {
      (*(local_98->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])
                ();
    }
    bVar8 = true;
  }
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&loads.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return bVar8;
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeLoad(
    Instruction* load, const std::vector<Instruction*>& replacements) {
  // Replaces the load of the entire composite with a load from each replacement
  // variable followed by a composite construction.
  BasicBlock* block = context()->get_instr_block(load);
  std::vector<Instruction*> loads;
  loads.reserve(replacements.size());
  BasicBlock::iterator where(load);
  for (auto var : replacements) {
    // Create a load of each replacement variable.
    if (var->opcode() != spv::Op::OpVariable) {
      loads.push_back(var);
      continue;
    }

    Instruction* type = GetStorageType(var);
    uint32_t loadId = TakeNextId();
    if (loadId == 0) {
      return false;
    }
    std::unique_ptr<Instruction> newLoad(
        new Instruction(context(), spv::Op::OpLoad, type->result_id(), loadId,
                        std::initializer_list<Operand>{
                            {SPV_OPERAND_TYPE_ID, {var->result_id()}}}));
    // Copy memory access attributes which start at index 1. Index 0 is the
    // pointer to load.
    for (uint32_t i = 1; i < load->NumInOperands(); ++i) {
      Operand copy(load->GetInOperand(i));
      newLoad->AddOperand(std::move(copy));
    }
    where = where.InsertBefore(std::move(newLoad));
    get_def_use_mgr()->AnalyzeInstDefUse(&*where);
    context()->set_instr_block(&*where, block);
    where->UpdateDebugInfoFrom(load);
    loads.push_back(&*where);
  }

  // Construct a new composite.
  uint32_t compositeId = TakeNextId();
  if (compositeId == 0) {
    return false;
  }
  where = load;
  std::unique_ptr<Instruction> compositeConstruct(
      new Instruction(context(), spv::Op::OpCompositeConstruct, load->type_id(),
                      compositeId, {}));
  for (auto l : loads) {
    Operand op(SPV_OPERAND_TYPE_ID,
               std::initializer_list<uint32_t>{l->result_id()});
    compositeConstruct->AddOperand(std::move(op));
  }
  where = where.InsertBefore(std::move(compositeConstruct));
  get_def_use_mgr()->AnalyzeInstDefUse(&*where);
  where->UpdateDebugInfoFrom(load);
  context()->set_instr_block(&*where, block);
  context()->ReplaceAllUsesWith(load->result_id(), compositeId);
  return true;
}